

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayout::constrainedRect(QDockAreaLayout *this,QRect rect,QWidget *widget)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  QRect QVar17;
  QArrayDataPointer<QScreen_*> local_50;
  long local_38;
  ulong uVar14;
  
  uVar6 = rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar14 = (ulong)this >> 0x20;
  iVar13 = (int)((ulong)this >> 0x20);
  uVar9 = uVar6 >> 0x20;
  QGuiApplication::primaryScreen();
  QScreen::virtualSiblings();
  QArrayDataPointer<QScreen_*>::~QArrayDataPointer(&local_50);
  if (1 < (ulong)local_50.size) {
    local_50.d = (Data *)this;
    lVar3 = QGuiApplication::screenAt((QPoint *)&local_50);
    if (lVar3 != 0) goto LAB_003cca31;
  }
  QWidget::screen(rect._8_8_);
LAB_003cca31:
  auVar16 = QScreen::geometry();
  iVar1 = auVar16._0_4_;
  iVar5 = auVar16._8_4_;
  iVar4 = auVar16._4_4_;
  iVar10 = auVar16._12_4_;
  if (iVar4 <= iVar10 && iVar1 <= iVar5) {
    iVar7 = (int)this;
    iVar15 = (rect.x1.m_i.m_i - iVar7) + 1;
    iVar11 = (iVar5 - iVar1) + 1;
    if (iVar15 < iVar11) {
      iVar11 = iVar15;
    }
    iVar8 = (rect.y1.m_i.m_i - iVar13) + 1;
    iVar15 = (iVar10 - iVar4) + 1;
    if (iVar8 < iVar15) {
      iVar15 = iVar8;
    }
    if (iVar7 <= iVar1) {
      iVar7 = iVar1;
    }
    uVar2 = (iVar7 + iVar11) - 1;
    if (iVar4 < iVar13) {
      iVar4 = iVar13;
    }
    uVar12 = (iVar4 + iVar15) - 1;
    uVar6 = auVar16._8_8_ & 0xffffffff;
    if ((int)uVar2 < iVar5) {
      uVar6 = (ulong)uVar2;
    }
    this = (QDockAreaLayout *)(ulong)((iVar7 - uVar2) + (int)uVar6);
    uVar9 = auVar16._8_8_ >> 0x20;
    if ((int)uVar12 < iVar10) {
      uVar9 = (ulong)uVar12;
    }
    uVar14 = (ulong)((iVar4 - uVar12) + (int)uVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar17._0_8_ = (ulong)this & 0xffffffff | uVar14 << 0x20;
    QVar17._8_8_ = uVar6 & 0xffffffff | uVar9 << 0x20;
    return QVar17;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayout::constrainedRect(QRect rect, QWidget* widget)
{
    QScreen *screen = nullptr;
    if (QGuiApplication::primaryScreen()->virtualSiblings().size() > 1)
        screen = QGuiApplication::screenAt(rect.topLeft());
    if (!screen)
        screen = widget->screen();

    const QRect screenRect = screen->geometry();
    if (screenRect.isValid()) {
        rect.setWidth(qMin(rect.width(), screenRect.width()));
        rect.setHeight(qMin(rect.height(), screenRect.height()));
        rect.moveLeft(qMax(rect.left(), screenRect.left()));
        rect.moveTop(qMax(rect.top(), screenRect.top()));
        rect.moveRight(qMin(rect.right(), screenRect.right()));
        rect.moveBottom(qMin(rect.bottom(), screenRect.bottom()));
    }

    return rect;
}